

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msf_gif.h
# Opt level: O1

void msf_free_gif_state(MsfGifState *handle)

{
  uint32_t *puVar1;
  MsfGifBuffer *pMVar2;
  MsfGifBuffer *__ptr;
  
  puVar1 = (handle->previousFrame).pixels;
  if (puVar1 != (uint32_t *)0x0) {
    free(puVar1);
  }
  puVar1 = (handle->currentFrame).pixels;
  if (puVar1 != (uint32_t *)0x0) {
    free(puVar1);
  }
  if (handle->lzwMem != (int16_t *)0x0) {
    free(handle->lzwMem);
  }
  __ptr = handle->listHead;
  while (__ptr != (MsfGifBuffer *)0x0) {
    pMVar2 = __ptr->next;
    free(__ptr);
    __ptr = pMVar2;
  }
  handle->listHead = (MsfGifBuffer *)0x0;
  return;
}

Assistant:

static void msf_free_gif_state(MsfGifState * handle) {
    if (handle->previousFrame.pixels) MSF_GIF_FREE(handle->customAllocatorContext, handle->previousFrame.pixels,
                                                   handle->width * handle->height * sizeof(uint32_t));
    if (handle->currentFrame.pixels)  MSF_GIF_FREE(handle->customAllocatorContext, handle->currentFrame.pixels,
                                                   handle->width * handle->height * sizeof(uint32_t));
    if (handle->lzwMem) MSF_GIF_FREE(handle->customAllocatorContext, handle->lzwMem, lzwAllocSize);
    for (MsfGifBuffer * node = handle->listHead; node;) {
        MsfGifBuffer * next = node->next; //NOTE: we have to copy the `next` pointer BEFORE freeing the node holding it
        MSF_GIF_FREE(handle->customAllocatorContext, node, offsetof(MsfGifBuffer, data) + node->size);
        node = next;
    }
    handle->listHead = NULL; //this implicitly marks the handle as invalid until the next msf_gif_begin() call
}